

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fak_algorithm.c
# Opt level: O0

void fak_a(void)

{
  point *ppVar1;
  kca_joint *joint;
  int local_100;
  int i;
  solver_state_a s;
  kca_kinematic_chain *kc;
  
  s.f_ext_tf = (ma_wrench *)&two_dof_robot_a;
  setup_simple_state_a(&two_dof_robot_a,&local_100);
  for (joint._4_4_ = 1; joint._4_4_ < local_100 + 1; joint._4_4_ = joint._4_4_ + 1) {
    ppVar1 = (s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc + 4;
    kca_fpk(ppVar1,s._8_8_ + (long)(joint._4_4_ + -1) * 0x20);
    ga_pose_compose(s._8_8_ + (long)(joint._4_4_ + -1) * 0x20,
                    (s.f_ext_tf)->point + (long)(joint._4_4_ + -1) * 0xc,
                    s.x_jnt + (joint._4_4_ + -1));
    kca_fvk(ppVar1,s.x_tot + (joint._4_4_ + -1));
    ga_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xd_tf + (joint._4_4_ + -1),
               s.xd_jnt + (joint._4_4_ + -1));
    ga_twist_accumulate(s.xd_jnt + (joint._4_4_ + -1),s.x_tot + (joint._4_4_ + -1),
                        s.xd_tf + joint._4_4_);
    kca_fak(ppVar1,s.xd + (joint._4_4_ + -1));
    kca_inertial_acceleration(ppVar1,s.xd_tf + joint._4_4_,s.xdd_jnt + (joint._4_4_ + -1));
    ga_acc_twist_add(s.xd + (joint._4_4_ + -1),s.xdd_jnt + (joint._4_4_ + -1),
                     s.xdd_bias + (joint._4_4_ + -1));
    ga_acc_twist_tf_ref_to_tgt
              (s.x_jnt + (joint._4_4_ + -1),s.xdd_nact + (joint._4_4_ + -1),
               s.xdd_net + (joint._4_4_ + -1));
    ga_acc_twist_accumulate
              (s.xdd_net + (joint._4_4_ + -1),s.xdd_bias + (joint._4_4_ + -1),
               s.xdd_nact + joint._4_4_);
  }
  ga_acc_twist_log(s.xdd_nact + local_100);
  return;
}

Assistant:

void fak_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);


        // Acceleration
        //

        // Xdd_{J,i} = S_i qdd_i
        kca_fak(joint, &s.xdd_jnt[i - 1]);

        // Xdd_{bias,i} = S_i qdd_i + Sd_i qd_i + Xd_i x S_i qd_i
        kca_inertial_acceleration(joint, &s.xd[i], &s.xdd_bias[i - 1]);

        // Xdd_{J,i}' = Xdd_{J,i} + Xdd_{bias,i}
        ga_acc_twist_add(&s.xdd_jnt[i - 1], &s.xdd_bias[i - 1], &s.xdd_net[i - 1]);

        // Xdd_{i-1}' = i^X_{i-1} Xdd_{i-1}
        ga_acc_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xdd[i - 1], &s.xdd_tf[i - 1]);

        // Xdd_i = Xdd_{i-1}' + Xdd_{J,i}'
        ga_acc_twist_accumulate(&s.xdd_tf[i - 1], &s.xdd_net[i - 1], &s.xdd[i]);
    }

    ga_acc_twist_log(&s.xdd[s.nbody]);
}